

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O3

void madvise_checked(void *ptr,size_t size,int flags)

{
  int iVar1;
  
  if (((~flags & 0x80000004U) == 0 && ptr != (void *)0x0) &&
     (iVar1 = madvise(ptr,size,0x10), iVar1 != 0)) {
    madvise_checked_cold_1();
  }
  return;
}

Assistant:

static void
madvise_checked(void *ptr, size_t size, int flags)
{
#ifdef TARANTOOL_SMALL_USE_MADVISE
	if (!ptr)
		return;

	if (!IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_DONTDUMP))
		return;

	if (madvise(ptr, size, MADV_DONTDUMP)) {
		intptr_t ignore_it;
		char buf[64];

		ignore_it = (intptr_t)strerror_r(errno, buf, sizeof(buf));
		(void)ignore_it;

		fprintf(stderr, "Error in madvise(%p, %zu, 0x%x): %s\n",
			ptr, size, MADV_DONTDUMP, buf);
	}
#else
	(void)ptr;
	(void)size;
	(void)flags;
#endif
}